

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall Heap::sort_down(Heap *this,GridNode *item)

{
  int iVar1;
  int iVar2;
  int local_24;
  int newIndex;
  int childIndex2;
  int childIndex1;
  GridNode *item_local;
  Heap *this_local;
  
  while( true ) {
    local_24 = item->index * 2 + 1;
    iVar1 = item->index * 2 + 2;
    if (this->count <= local_24) {
      return;
    }
    if ((iVar1 < this->count) &&
       (iVar2 = GridNode::compare_item(this->list[local_24],this->list[iVar1]), iVar2 < 0)) {
      local_24 = iVar1;
    }
    iVar1 = GridNode::compare_item(item,this->list[local_24]);
    if (-1 < iVar1) break;
    swap_items(this,this->list[local_24],item);
  }
  return;
}

Assistant:

void sort_down(GridNode *item)
    {
        while (true)
        {
            int childIndex1 = item->index * 2 + 1;
            int childIndex2 = item->index * 2 + 2;
            int newIndex = 0;
            if (childIndex1 < count)
            {
                newIndex = childIndex1;
                if (childIndex2 < count)
                {
                    if (list[childIndex1]->compare_item(list[childIndex2]) < 0)
                    {
                        newIndex = childIndex2;
                    }
                }
                if (item->compare_item(list[newIndex]) < 0)
                {
                    swap_items(list[newIndex], item);
                }
                else
                {
                    return;
                }
            }
            else
            {
                return;
            }
        }
    }